

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_tostring.hpp
# Opt level: O0

Catch * __thiscall Catch::toString_abi_cxx11_(Catch *this,unsigned_long value)

{
  ostream *poVar1;
  void *this_00;
  ostringstream local_190 [8];
  ostringstream oss;
  unsigned_long value_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::operator<<(local_190,value);
  if (0xff < value) {
    poVar1 = std::operator<<((ostream *)local_190," (0x");
    this_00 = (void *)std::ostream::operator<<(poVar1,std::hex);
    poVar1 = (ostream *)std::ostream::operator<<(this_00,value);
    std::operator<<(poVar1,")");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

std::string toString( unsigned long value ) {
    std::ostringstream oss;
    oss << value;
    if( value > Detail::hexThreshold )
        oss << " (0x" << std::hex << value << ")";
    return oss.str();
}